

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.cpp
# Opt level: O1

void __thiscall uv11::Async::Async(Async *this,Loop *loop,Callback *cb)

{
  WrappedObject<uv_async_s> *h;
  uv_loop_t *puVar1;
  
  h = &(this->super_HandleBase<uv_async_s>).super_WrappedObject<uv_async_s>;
  (this->super_HandleBase<uv_async_s>).super_WrappedObject<uv_async_s>.t.queue[1] = (void *)0x0;
  *(undefined8 *)&(this->super_HandleBase<uv_async_s>).super_WrappedObject<uv_async_s>.t.pending = 0
  ;
  (this->super_HandleBase<uv_async_s>).super_WrappedObject<uv_async_s>.t.async_cb = (uv_async_cb)0x0
  ;
  (this->super_HandleBase<uv_async_s>).super_WrappedObject<uv_async_s>.t.queue[0] = (void *)0x0;
  (this->super_HandleBase<uv_async_s>).super_WrappedObject<uv_async_s>.t.next_closing =
       (uv_handle_t *)0x0;
  *(undefined8 *)&(this->super_HandleBase<uv_async_s>).super_WrappedObject<uv_async_s>.t.flags = 0;
  (this->super_HandleBase<uv_async_s>).super_WrappedObject<uv_async_s>.t.u.reserved[2] = (void *)0x0
  ;
  (this->super_HandleBase<uv_async_s>).super_WrappedObject<uv_async_s>.t.u.reserved[3] = (void *)0x0
  ;
  (this->super_HandleBase<uv_async_s>).super_WrappedObject<uv_async_s>.t.u.reserved[0] = (void *)0x0
  ;
  (this->super_HandleBase<uv_async_s>).super_WrappedObject<uv_async_s>.t.u.reserved[1] = (void *)0x0
  ;
  (this->super_HandleBase<uv_async_s>).super_WrappedObject<uv_async_s>.t.handle_queue[0] =
       (void *)0x0;
  (this->super_HandleBase<uv_async_s>).super_WrappedObject<uv_async_s>.t.handle_queue[1] =
       (void *)0x0;
  *(undefined8 *)&(this->super_HandleBase<uv_async_s>).super_WrappedObject<uv_async_s>.t.type = 0;
  (this->super_HandleBase<uv_async_s>).super_WrappedObject<uv_async_s>.t.close_cb = (uv_close_cb)0x0
  ;
  (this->super_HandleBase<uv_async_s>).super_WrappedObject<uv_async_s>.t.data = (void *)0x0;
  (this->super_HandleBase<uv_async_s>).super_WrappedObject<uv_async_s>.t.loop = (uv_loop_t *)0x0;
  (this->super_HandleBase<uv_async_s>).super_Handle._vptr_Handle =
       (_func_int **)&PTR__Handle_0010ccb0;
  Handle::Handle((Handle *)this,(uv_handle_t *)h,this);
  (this->super_HandleBase<uv_async_s>).super_Handle._vptr_Handle =
       (_func_int **)&PTR__Async_0010cc30;
  std::function<void_(uv11::Async_&)>::function(&this->async_cb,cb);
  puVar1 = Loop::Get(loop);
  uv_async_init(puVar1,h,Async::anon_class_1_0_00000001::__invoke);
  return;
}

Assistant:

Async::Async(Loop& loop, Async::Callback const& cb) : HandleBase(this), async_cb(cb) {
    ::uv_async_init(&loop.Get(), &this->Get(), [] (::uv_async_t* handle ) {
        Async* a = reinterpret_cast<Async*>(handle->data);
        auto callback = a->async_cb;
        callback(*a);
    });
}